

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void I422ToRGBARow_SSSE3(uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_rgba,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined8 uVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined6 uVar58;
  long lVar59;
  int iVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar76 [16];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_rgba_local;
  uint8_t *v_buf_local;
  uint8_t *u_buf_local;
  uint8_t *y_buf_local;
  undefined2 uVar63;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 uVar77;
  
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar34 = yuvconstants->kUVBiasB[0];
  sVar35 = yuvconstants->kUVBiasB[1];
  sVar36 = yuvconstants->kUVBiasB[2];
  sVar37 = yuvconstants->kUVBiasB[3];
  sVar38 = yuvconstants->kUVBiasB[4];
  sVar39 = yuvconstants->kUVBiasB[5];
  sVar40 = yuvconstants->kUVBiasB[6];
  sVar41 = yuvconstants->kUVBiasB[7];
  sVar42 = yuvconstants->kUVBiasG[0];
  sVar43 = yuvconstants->kUVBiasG[1];
  sVar44 = yuvconstants->kUVBiasG[2];
  sVar45 = yuvconstants->kUVBiasG[3];
  sVar46 = yuvconstants->kUVBiasG[4];
  sVar47 = yuvconstants->kUVBiasG[5];
  sVar48 = yuvconstants->kUVBiasG[6];
  sVar49 = yuvconstants->kUVBiasG[7];
  sVar50 = yuvconstants->kUVBiasR[0];
  sVar51 = yuvconstants->kUVBiasR[1];
  sVar52 = yuvconstants->kUVBiasR[2];
  sVar53 = yuvconstants->kUVBiasR[3];
  sVar54 = yuvconstants->kUVBiasR[4];
  sVar55 = yuvconstants->kUVBiasR[5];
  sVar56 = yuvconstants->kUVBiasR[6];
  sVar57 = yuvconstants->kUVBiasR[7];
  auVar5 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar59 = (long)v_buf - (long)u_buf;
  do {
    uVar6 = *(undefined4 *)u_buf;
    uVar7 = *(undefined4 *)(u_buf + lVar59);
    u_buf = u_buf + 4;
    uVar63 = CONCAT11((char)((uint)uVar7 >> 0x18),(char)((uint)uVar6 >> 0x18));
    uVar33 = CONCAT35(CONCAT21(uVar63,(char)((uint)uVar7 >> 0x10)),
                      CONCAT14((char)((uint)uVar6 >> 0x10),uVar6));
    uVar58 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),(char)((uint)uVar7 >> 8)),
                      (char)((uint)uVar6 >> 8));
    auVar67._0_2_ = CONCAT11((char)uVar7,(char)uVar6);
    uVar1 = CONCAT62(uVar58,auVar67._0_2_);
    auVar61._8_4_ = 0;
    auVar61._0_8_ = uVar1;
    auVar61._12_2_ = uVar63;
    auVar61._14_2_ = uVar63;
    uVar63 = (undefined2)((ulong)uVar33 >> 0x20);
    auVar76._12_4_ = auVar61._12_4_;
    auVar76._8_2_ = 0;
    auVar76._0_8_ = uVar1;
    auVar76._10_2_ = uVar63;
    auVar64._10_6_ = auVar76._10_6_;
    auVar64._8_2_ = uVar63;
    auVar64._0_8_ = uVar1;
    uVar63 = (undefined2)uVar58;
    auVar67._8_8_ = auVar64._8_8_;
    auVar67._6_2_ = uVar63;
    auVar67._4_2_ = uVar63;
    auVar67._2_2_ = auVar67._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar77 = (undefined1)(uVar1 >> 0x38);
    auVar75._8_6_ = 0;
    auVar75._0_8_ = uVar1;
    auVar75[0xe] = uVar77;
    auVar75[0xf] = uVar77;
    uVar77 = (undefined1)(uVar1 >> 0x30);
    auVar74._14_2_ = auVar75._14_2_;
    auVar74._8_5_ = 0;
    auVar74._0_8_ = uVar1;
    auVar74[0xd] = uVar77;
    auVar73._13_3_ = auVar74._13_3_;
    auVar73._8_4_ = 0;
    auVar73._0_8_ = uVar1;
    auVar73[0xc] = uVar77;
    uVar77 = (undefined1)(uVar1 >> 0x28);
    auVar72._12_4_ = auVar73._12_4_;
    auVar72._8_3_ = 0;
    auVar72._0_8_ = uVar1;
    auVar72[0xb] = uVar77;
    auVar71._11_5_ = auVar72._11_5_;
    auVar71._8_2_ = 0;
    auVar71._0_8_ = uVar1;
    auVar71[10] = uVar77;
    uVar77 = (undefined1)(uVar1 >> 0x20);
    auVar70._10_6_ = auVar71._10_6_;
    auVar70[8] = 0;
    auVar70._0_8_ = uVar1;
    auVar70[9] = uVar77;
    auVar69._9_7_ = auVar70._9_7_;
    auVar69[8] = uVar77;
    auVar69._0_8_ = uVar1;
    uVar77 = (undefined1)(uVar1 >> 0x18);
    auVar68._8_8_ = auVar69._8_8_;
    auVar68[7] = uVar77;
    auVar68[6] = uVar77;
    uVar77 = (undefined1)(uVar1 >> 0x10);
    auVar68[5] = uVar77;
    auVar68[4] = uVar77;
    uVar77 = (undefined1)(uVar1 >> 8);
    auVar68[3] = uVar77;
    auVar68[2] = uVar77;
    auVar68[0] = (undefined1)uVar1;
    auVar68[1] = auVar68[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar64 = pmaddubsw(auVar67,auVar2);
    auVar62._0_2_ = sVar34 - auVar64._0_2_;
    auVar62._2_2_ = sVar35 - auVar64._2_2_;
    auVar62._4_2_ = sVar36 - auVar64._4_2_;
    auVar62._6_2_ = sVar37 - auVar64._6_2_;
    auVar62._8_2_ = sVar38 - auVar64._8_2_;
    auVar62._10_2_ = sVar39 - auVar64._10_2_;
    auVar62._12_2_ = sVar40 - auVar64._12_2_;
    auVar62._14_2_ = sVar41 - auVar64._14_2_;
    auVar64 = pmaddubsw(auVar67,auVar3);
    auVar65._0_2_ = sVar42 - auVar64._0_2_;
    auVar65._2_2_ = sVar43 - auVar64._2_2_;
    auVar65._4_2_ = sVar44 - auVar64._4_2_;
    auVar65._6_2_ = sVar45 - auVar64._6_2_;
    auVar65._8_2_ = sVar46 - auVar64._8_2_;
    auVar65._10_2_ = sVar47 - auVar64._10_2_;
    auVar65._12_2_ = sVar48 - auVar64._12_2_;
    auVar65._14_2_ = sVar49 - auVar64._14_2_;
    auVar67 = pmaddubsw(auVar67,auVar4);
    auVar66._0_2_ = sVar50 - auVar67._0_2_;
    auVar66._2_2_ = sVar51 - auVar67._2_2_;
    auVar66._4_2_ = sVar52 - auVar67._4_2_;
    auVar66._6_2_ = sVar53 - auVar67._6_2_;
    auVar66._8_2_ = sVar54 - auVar67._8_2_;
    auVar66._10_2_ = sVar55 - auVar67._10_2_;
    auVar66._12_2_ = sVar56 - auVar67._12_2_;
    auVar66._14_2_ = sVar57 - auVar67._14_2_;
    auVar76 = pmulhuw(auVar68,auVar5);
    auVar67 = paddsw(auVar62,auVar76);
    auVar64 = paddsw(auVar65,auVar76);
    auVar76 = paddsw(auVar66,auVar76);
    auVar67 = psraw(auVar67,6);
    auVar64 = psraw(auVar64,6);
    auVar76 = psraw(auVar76,6);
    sVar9 = auVar67._0_2_;
    sVar12 = auVar67._2_2_;
    sVar15 = auVar67._4_2_;
    sVar18 = auVar67._6_2_;
    sVar21 = auVar67._8_2_;
    sVar24 = auVar67._10_2_;
    sVar27 = auVar67._12_2_;
    sVar30 = auVar67._14_2_;
    sVar10 = auVar64._0_2_;
    sVar13 = auVar64._2_2_;
    sVar16 = auVar64._4_2_;
    sVar19 = auVar64._6_2_;
    sVar22 = auVar64._8_2_;
    sVar25 = auVar64._10_2_;
    sVar28 = auVar64._12_2_;
    sVar31 = auVar64._14_2_;
    sVar11 = auVar76._0_2_;
    sVar14 = auVar76._2_2_;
    sVar17 = auVar76._4_2_;
    sVar20 = auVar76._6_2_;
    sVar23 = auVar76._8_2_;
    sVar26 = auVar76._10_2_;
    sVar29 = auVar76._12_2_;
    sVar32 = auVar76._14_2_;
    *dst_rgba = 0xff;
    dst_rgba[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar67[0] - (0xff < sVar9);
    dst_rgba[2] = (0 < sVar10) * (sVar10 < 0x100) * auVar64[0] - (0xff < sVar10);
    dst_rgba[3] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[0] - (0xff < sVar11);
    dst_rgba[4] = 0xff;
    dst_rgba[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar67[2] - (0xff < sVar12);
    dst_rgba[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar64[2] - (0xff < sVar13);
    dst_rgba[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[2] - (0xff < sVar14);
    dst_rgba[8] = 0xff;
    dst_rgba[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar67[4] - (0xff < sVar15);
    dst_rgba[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar64[4] - (0xff < sVar16);
    dst_rgba[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar76[4] - (0xff < sVar17);
    dst_rgba[0xc] = 0xff;
    dst_rgba[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar67[6] - (0xff < sVar18);
    dst_rgba[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar64[6] - (0xff < sVar19);
    dst_rgba[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar76[6] - (0xff < sVar20);
    dst_rgba[0x11] = 0xff;
    dst_rgba[0x12] = (0 < sVar21) * (sVar21 < 0x100) * auVar67[8] - (0xff < sVar21);
    dst_rgba[0x1a] = (0 < sVar22) * (sVar22 < 0x100) * auVar64[8] - (0xff < sVar22);
    dst_rgba[0x1b] = (0 < sVar23) * (sVar23 < 0x100) * auVar76[8] - (0xff < sVar23);
    dst_rgba[0x1e] = 0xff;
    dst_rgba[0x1f] = (0 < sVar24) * (sVar24 < 0x100) * auVar67[10] - (0xff < sVar24);
    dst_rgba[0x20] = (0 < sVar25) * (sVar25 < 0x100) * auVar64[10] - (0xff < sVar25);
    dst_rgba[0x21] = (0 < sVar26) * (sVar26 < 0x100) * auVar76[10] - (0xff < sVar26);
    dst_rgba[0x24] = 0xff;
    dst_rgba[0x25] = (0 < sVar27) * (sVar27 < 0x100) * auVar67[0xc] - (0xff < sVar27);
    dst_rgba[0x26] = (0 < sVar28) * (sVar28 < 0x100) * auVar64[0xc] - (0xff < sVar28);
    dst_rgba[0x27] = (0 < sVar29) * (sVar29 < 0x100) * auVar76[0xc] - (0xff < sVar29);
    dst_rgba[0x2a] = 0xff;
    dst_rgba[0x2b] = (0 < sVar30) * (sVar30 < 0x100) * auVar67[0xe] - (0xff < sVar30);
    dst_rgba[0x2c] = (0 < sVar31) * (sVar31 < 0x100) * auVar64[0xe] - (0xff < sVar31);
    dst_rgba[0x2d] = (0 < sVar32) * (sVar32 < 0x100) * auVar76[0xe] - (0xff < sVar32);
    dst_rgba = dst_rgba + 0x20;
    iVar60 = width + -8;
    bVar8 = 7 < width;
    width = iVar60;
  } while (iVar60 != 0 && bVar8);
  return;
}

Assistant:

void OMITFP I422ToRGBARow_SSSE3(const uint8_t* y_buf,
                                const uint8_t* u_buf,
                                const uint8_t* v_buf,
                                uint8_t* dst_rgba,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READYUV422
    YUVTORGB(yuvconstants)
    STORERGBA
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_rgba]"+r"(dst_rgba),  // %[dst_rgba]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
}